

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall
chrono::ChBody::IntLoadResidual_Mv
          (ChBody *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChVector<double> local_a0;
  double local_88;
  double dStack_80;
  double local_78;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_68 [56];
  
  dVar1 = (this->variables).mass;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,(ulong)off);
  dVar2 = *pdVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,(ulong)off);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = c * dVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar7;
  auVar3 = vfmadd213sd_fma(auVar11,auVar8,auVar3);
  *pSVar7 = auVar3._0_8_;
  dVar1 = (this->variables).mass;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 1));
  dVar2 = *pdVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                      (ulong)(off + 1));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = c * dVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar7;
  auVar3 = vfmadd213sd_fma(auVar12,auVar9,auVar4);
  *pSVar7 = auVar3._0_8_;
  dVar1 = (this->variables).mass;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                      (ulong)(off + 2));
  dVar2 = *pdVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                      (ulong)(off + 2));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = c * dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *pSVar7;
  auVar3 = vfmadd213sd_fma(auVar13,auVar10,auVar5);
  *pSVar7 = auVar3._0_8_;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,w,
             (ulong)(off + 3),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_a0,local_68,(type *)0x0);
  ChMatrix33<double>::operator*(&(this->variables).inertia,&local_a0);
  local_88 = c * local_88;
  dStack_80 = c * dStack_80;
  local_78 = c * local_78;
  local_a0.m_data[0] = (double)&local_88;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,R,(ulong)(off + 3),
             3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)local_68,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_a0);
  return;
}

Assistant:

void ChBody::IntLoadResidual_Mv(const unsigned int off,      // offset in R residual
                                ChVectorDynamic<>& R,        // result: the R residual, R += c*M*v
                                const ChVectorDynamic<>& w,  // the w vector
                                const double c               // a scaling factor
) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    ChVector<> Iw = GetInertia() * ChVector<>(w.segment(off + 3, 3));
    Iw *= c;
    R.segment(off + 3, 3) += Iw.eigen();
}